

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARPController.cpp
# Opt level: O2

void __thiscall ARPController::reply(ARPController *this,uint8_t *data,size_t size)

{
  undefined2 uVar1;
  NetworkDevice *pNVar2;
  uint8_t *puVar3;
  undefined8 in_RAX;
  undefined2 *__n;
  ssize_t sVar4;
  ostream *poVar5;
  HwAddr addr;
  
  __n = (undefined2 *)operator_new(0x1c);
  __n[3] = 0x200;
  *(uint8_t *)(__n + 2) = data[4];
  *__n = *(undefined2 *)data;
  *(uint8_t *)((long)__n + 5) = data[5];
  __n[1] = *(undefined2 *)(data + 2);
  *(undefined4 *)(__n + 0xc) = *(undefined4 *)(data + 0xe);
  pNVar2 = this->dev;
  *(uint32_t *)(__n + 7) = pNVar2->ip_addr;
  *(undefined4 *)(__n + 9) = *(undefined4 *)(data + 8);
  __n[0xb] = *(undefined2 *)(data + 0xc);
  puVar3 = pNVar2->mac_addr;
  uVar1 = *(undefined2 *)(puVar3 + 4);
  *(undefined4 *)(__n + 4) = *(undefined4 *)puVar3;
  __n[6] = uVar1;
  _addr = CONCAT44(CONCAT22((short)((ulong)in_RAX >> 0x30),*(undefined2 *)(data + 0xc)),
                   *(undefined4 *)(data + 8));
  sVar4 = Ethernet::send(this->eth,(int)&addr,(void *)0x806,(size_t)__n,0x1c);
  if (sVar4 < 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"ARP reply failure");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
  }
  operator_delete(__n,0x1c);
  return;
}

Assistant:

void ARPController::reply(uint8_t const *data, size_t size) const {
    auto *arp = reinterpret_cast<arp_t const *>(data);
    auto *resp = new arp_t();

    resp->opcode = static_cast<uint16_t>(Opcode::Reply);
    resp->hw_addr_len = arp->hw_addr_len;
    resp->hw_type = arp->hw_type;
    resp->protocol_addr_len = arp->protocol_addr_len;
    resp->protocol_type = arp->protocol_type;

    resp->target_protocol_addr = arp->sender_protocol_addr;
    resp->sender_protocol_addr = dev.ip_addr;
    std::copy(arp->sender_hw_addr, arp->sender_hw_addr + 6, resp->target_hw_addr);
    std::copy(dev.mac_addr, dev.mac_addr + 6, resp->sender_hw_addr);

    Ethernet::HwAddr addr;
    std::copy(arp->sender_hw_addr, arp->sender_hw_addr + 6, std::begin(addr));

    ssize_t n = eth.send(addr, Ethernet::protocol::ARP, reinterpret_cast<uint8_t *>(resp), sizeof(struct arp_t));
    if (n <= 0) {
        std::cerr << "ARP reply failure" << std::endl;
        std::cerr.flush();
    }
    delete resp;
}